

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ArrayCpyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayCpyExpr *this)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ArrayCpyExpr *local_18;
  ArrayCpyExpr *this_local;
  
  local_18 = this;
  this_local = (ArrayCpyExpr *)__return_storage_ptr__;
  pEVar1 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->valueExpr);
  (*pEVar1->_vptr_Expr[2])();
  std::operator+(&local_78,'[',&local_98);
  std::operator+(&local_58,&local_78,"; ");
  pEVar1 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->lengthExpr);
  (*pEVar1->_vptr_Expr[2])();
  std::operator+(&local_38,&local_58,&local_b8);
  std::operator+(__return_storage_ptr__,&local_38,']');
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayCpyExpr::toString() const noexcept {
  return '[' + valueExpr->toString() + "; " + lengthExpr->toString() + ']';
}